

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O1

void Kit_SopCreate(Kit_Sop_t *cResult,Vec_Int_t *vInput,int nVars,Vec_Int_t *vMemory)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  
  cResult->nCubes = 0;
  uVar1 = vInput->nSize;
  if ((ulong)uVar1 != 0) {
    if ((int)uVar1 < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar4 = (long)(int)uVar1 + (long)vMemory->nSize;
    iVar3 = (int)lVar4;
    vMemory->nSize = iVar3;
    if (iVar3 <= vMemory->nCap) {
      puVar5 = (uint *)(vMemory->pArray + (lVar4 - (ulong)uVar1));
      goto LAB_005d875c;
    }
  }
  puVar5 = (uint *)0x0;
LAB_005d875c:
  cResult->pCubes = puVar5;
  if (0 < vInput->nSize) {
    piVar2 = vInput->pArray;
    lVar4 = 0;
    do {
      uVar1 = piVar2[lVar4];
      iVar3 = cResult->nCubes;
      cResult->nCubes = iVar3 + 1;
      puVar5[iVar3] = uVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vInput->nSize);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates SOP from the cube array.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Kit_SopCreate( Kit_Sop_t * cResult, Vec_Int_t * vInput, int nVars, Vec_Int_t * vMemory )
{
    unsigned uCube;
    int i;
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, Vec_IntSize(vInput) );
    // add the cubes
    Vec_IntForEachEntry( vInput, uCube, i )
        Kit_SopPushCube( cResult, uCube );
}